

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O2

bool __thiscall verona::lookup_type(verona *this,Node *id,initializer_list<trieste::Token> t)

{
  bool bVar1;
  Lookups defs;
  Node local_68;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_58;
  initializer_list<trieste::Token> local_48;
  _Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
  local_38;
  
  local_48._M_len = (size_type)t._M_array;
  local_48._M_array = (iterator)id;
  ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lookup((Lookups *)&local_38,(Node *)&local_58,&local_68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  if (local_38._M_impl.super__Rb_tree_header._M_node_count == 1) {
    bVar1 = trieste::Token::in((Token *)(*(long *)(local_38._M_impl.super__Rb_tree_header._M_header.
                                                   _M_left + 1) + 0x10),&local_48);
  }
  else {
    bVar1 = false;
  }
  ::std::
  _Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
  ::~_Rb_tree(&local_38);
  return bVar1;
}

Assistant:

bool lookup_type(Node id, std::initializer_list<Token> t)
  {
    auto defs = lookup(id, {});
    return (defs.size() == 1) && defs.begin()->def->in(t);
  }